

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall UdpSocketImpl::SelectThread(UdpSocketImpl *this)

{
  atomic_uchar *paVar1;
  _Manager_type p_Var2;
  int iVar3;
  int iVar4;
  long *__s;
  int *piVar5;
  ssize_t sVar6;
  char *pcVar7;
  size_t sVar8;
  BaseSocket *pBVar9;
  undefined8 uVar10;
  int *piVar11;
  ulong uVar12;
  uchar *puVar13;
  bool bVar14;
  bool bReadCall;
  __array tmp;
  int32_t transferred;
  string caAddrBuf;
  socklen_t iLen;
  socklen_t sinLen;
  timeval timeout;
  anon_union_28_2_13231a05 SenderAddr;
  mutex mxNotify;
  fd_set errorfd;
  fd_set readfd;
  stringstream strAbsender;
  char local_3e2;
  bool local_3e1;
  _Head_base<0UL,_unsigned_char_*,_false> local_3e0;
  int local_3d4;
  long *local_3d0 [2];
  long local_3c0 [2];
  ulong local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  socklen_t local_384;
  pthread_mutex_t *local_380;
  _Any_data *local_378;
  _Any_data *local_370;
  timeval local_368;
  int *local_350;
  _Any_data *local_348;
  _Any_data *local_340;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_338;
  _Any_data *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  sockaddr local_304;
  pthread_mutex_t local_2e8;
  fd_set local_2b8;
  fd_set local_238;
  timespec local_1b8;
  long local_1a8 [14];
  ios_base aiStack_138 [264];
  
  local_3e2 = '\0';
  local_2e8._16_8_ = 0;
  local_2e8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_2e8.__align = 0;
  local_2e8._8_8_ = 0;
  local_2e8.__data.__list.__next = (__pthread_internal_list *)0x0;
  __s = (long *)operator_new__(0xffff);
  local_3b0 = 0;
  memset(__s,0,0xffff);
  piVar11 = &(this->super_BaseSocketImpl).m_iError;
  local_378 = (_Any_data *)&(this->super_BaseSocketImpl).m_fError;
  local_370 = (_Any_data *)&(this->super_BaseSocketImpl).m_fErrorParam;
  local_330 = (_Any_data *)&this->m_fnSslDecode;
  local_380 = (pthread_mutex_t *)&this->m_mxInDeque;
  local_338 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
               *)&this->m_quInData;
  local_348 = (_Any_data *)&this->m_fBytesReceived;
  local_340 = (_Any_data *)&this->m_fBytesReceivedParam;
LAB_0011c266:
  do {
    if ((this->super_BaseSocketImpl).m_bStop != false) goto LAB_0011cb08;
    if (0x40000 < (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i) {
      local_1b8.tv_sec = 0;
      local_1b8.tv_nsec = 1000000;
      do {
        iVar3 = nanosleep(&local_1b8,&local_1b8);
        if (iVar3 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      goto LAB_0011c266;
    }
    local_368.tv_sec = 2;
    local_368.tv_usec = 0;
    local_238.fds_bits[0xe] = 0;
    local_238.fds_bits[0xf] = 0;
    local_238.fds_bits[0xc] = 0;
    local_238.fds_bits[0xd] = 0;
    local_238.fds_bits[10] = 0;
    local_238.fds_bits[0xb] = 0;
    local_238.fds_bits[8] = 0;
    local_238.fds_bits[9] = 0;
    local_238.fds_bits[6] = 0;
    local_238.fds_bits[7] = 0;
    local_238.fds_bits[4] = 0;
    local_238.fds_bits[5] = 0;
    local_238.fds_bits[2] = 0;
    local_238.fds_bits[3] = 0;
    local_238.fds_bits[0] = 0;
    local_238.fds_bits[1] = 0;
    local_2b8.fds_bits[0xe] = 0;
    local_2b8.fds_bits[0xf] = 0;
    local_2b8.fds_bits[0xc] = 0;
    local_2b8.fds_bits[0xd] = 0;
    local_2b8.fds_bits[10] = 0;
    local_2b8.fds_bits[0xb] = 0;
    local_2b8.fds_bits[8] = 0;
    local_2b8.fds_bits[9] = 0;
    local_2b8.fds_bits[6] = 0;
    local_2b8.fds_bits[7] = 0;
    local_2b8.fds_bits[4] = 0;
    local_2b8.fds_bits[5] = 0;
    local_2b8.fds_bits[2] = 0;
    local_2b8.fds_bits[3] = 0;
    local_2b8.fds_bits[0] = 0;
    local_2b8.fds_bits[1] = 0;
    iVar3 = (this->super_BaseSocketImpl).m_fSock;
    iVar4 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar4 = iVar3;
    }
    uVar12 = 1L << ((byte)iVar3 & 0x3f);
    local_238.fds_bits[iVar4 >> 6] = local_238.fds_bits[iVar4 >> 6] | uVar12;
    local_2b8.fds_bits[iVar4 >> 6] = local_2b8.fds_bits[iVar4 >> 6] | uVar12;
    iVar3 = select(iVar3 + 1,&local_238,(fd_set *)0x0,&local_2b8,&local_368);
    bVar14 = true;
    if (0 < iVar3) {
      iVar3 = (this->super_BaseSocketImpl).m_fSock;
      iVar4 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      if (((ulong)local_2b8.fds_bits[iVar4 >> 6] >> ((ulong)(uint)(iVar3 % 0x40) & 0x3f) & 1) != 0)
      {
        local_3a8._M_dataplus._M_p._0_4_ = 4;
        getsockopt(iVar3,1,4,piVar11,(socklen_t *)&local_3a8);
        (this->super_BaseSocketImpl).m_iErrLoc = 7;
        bVar14 = (this->super_BaseSocketImpl).m_bStop;
        if (bVar14 == false &&
            (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
            (_Manager_type)0x0) {
          local_3d0[0] = (long *)(this->super_BaseSocketImpl).m_pvUserData;
          local_1b8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
          (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                    (local_370,(BaseSocket **)&local_1b8,local_3d0);
        }
        else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                 (_Manager_type)0x0 && bVar14 == false) {
          local_1b8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
          (*(this->super_BaseSocketImpl).m_fError._M_invoker)(local_378,(BaseSocket **)&local_1b8);
        }
        goto LAB_0011c5e7;
      }
      if ((local_238.fds_bits[iVar4 >> 6] & 1L << ((byte)(iVar3 % 0x40) & 0x3f)) != 0) {
        local_384 = 0x1c;
        uVar10 = 0;
        sVar6 = recvfrom(iVar3,__s,0xffff,0,&local_304,&local_384);
        local_3d4 = (int)sVar6;
        if (local_3d4 < 1) {
          if (local_3d4 == 0) {
            iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
            if (iVar3 != 0) {
              piVar5 = __errno_location();
              (this->super_BaseSocketImpl).m_iError = *piVar5;
              (this->super_BaseSocketImpl).m_iErrLoc = 9;
            }
            if (local_3e2 == '\x01') {
              do {
                local_1b8.tv_sec = 0;
                local_1b8.tv_nsec = 10000000;
                do {
                  iVar3 = nanosleep(&local_1b8,&local_1b8);
                  if (iVar3 != -1) break;
                  piVar5 = __errno_location();
                } while (*piVar5 == 4);
              } while (local_3e2 != '\0');
            }
            pBVar9 = (this->super_BaseSocketImpl).m_pBkRef;
            if (pBVar9 == (BaseSocket *)0x0) {
              pBVar9 = (BaseSocket *)0x0;
            }
            else {
              uVar10 = 0;
              pBVar9 = (BaseSocket *)
                       __dynamic_cast(pBVar9,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0);
            }
            if (pBVar9 == (BaseSocket *)0x0 ||
                (this->m_fBytesReceivedParam).super__Function_base._M_manager == (_Manager_type)0x0)
            {
              local_3b0 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
              if ((this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0 &&
                  pBVar9 != (BaseSocket *)0x0) {
                local_1b8.tv_sec = (__time_t)pBVar9;
                (*(this->m_fBytesReceived)._M_invoker)(local_348,(UdpSocket **)&local_1b8);
              }
            }
            else {
              local_3d0[0] = (long *)(this->super_BaseSocketImpl).m_pvUserData;
              local_1b8.tv_sec = (__time_t)pBVar9;
              uVar10 = (*(this->m_fBytesReceivedParam)._M_invoker)
                                 (local_340,(UdpSocket **)&local_1b8,local_3d0);
              local_3b0 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
            }
          }
          else {
            piVar5 = __errno_location();
            iVar3 = *piVar5;
            (this->super_BaseSocketImpl).m_iError = iVar3;
            bVar14 = true;
            if (iVar3 == 0xb) goto LAB_0011c5e9;
            (this->super_BaseSocketImpl).m_iErrLoc = 0xb;
            bVar14 = (this->super_BaseSocketImpl).m_bStop;
            if (bVar14 == false &&
                (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
                (_Manager_type)0x0) {
              local_3d0[0] = (long *)(this->super_BaseSocketImpl).m_pvUserData;
              local_1b8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
              (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                        (local_370,(BaseSocket **)&local_1b8,local_3d0);
            }
            else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                     (_Manager_type)0x0 && bVar14 == false) {
              local_1b8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
              (*(this->super_BaseSocketImpl).m_fError._M_invoker)
                        (local_378,(BaseSocket **)&local_1b8);
            }
          }
LAB_0011c5e7:
          bVar14 = false;
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
          local_3d0[0] = local_3c0;
          std::__cxx11::string::_M_construct((ulong)local_3d0,'/');
          if (local_304.sa_family == 10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
            pcVar7 = inet_ntop((uint)local_304.sa_family,local_304.sa_data + 6,(char *)local_3d0[0],
                               0x20);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]:",2);
          }
          else {
            pcVar7 = inet_ntop((uint)local_304.sa_family,local_304.sa_data + 2,(char *)local_3d0[0],
                               0x20);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          }
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          p_Var2 = (this->m_fnSslDecode).super__Function_base._M_manager;
          local_350 = piVar11;
          if (p_Var2 == (_Manager_type)0x0) {
            local_3e1 = true;
            bVar14 = true;
          }
          else {
            puVar13 = (uchar *)(long)local_3d4;
            std::__cxx11::stringbuf::str();
            local_3e0._M_head_impl = puVar13;
            local_3a8._M_dataplus._M_p = (pointer)__s;
            if ((this->m_fnSslDecode).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            iVar3 = (*(this->m_fnSslDecode)._M_invoker)
                              (local_330,(uchar **)&local_3a8,(unsigned_long *)&local_3e0,&local_328
                              );
            bVar14 = iVar3 == 0;
            local_3e1 = iVar3 != -1;
          }
          if ((p_Var2 != (_Manager_type)0x0) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2)) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          iVar3 = local_3d4;
          if (bVar14) {
            uVar12 = (ulong)local_3d4;
            puVar13 = (uchar *)operator_new__(uVar12);
            memset(puVar13,0,uVar12);
            local_3e0._M_head_impl = puVar13;
            if (0 < iVar3) {
              memcpy(puVar13,__s,uVar12);
            }
            iVar3 = pthread_mutex_lock(local_380);
            if (iVar3 != 0) {
              std::__throw_system_error(iVar3);
            }
            std::__cxx11::stringbuf::str();
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,int&,std::__cxx11::string>
                      (local_338,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &local_3e0,&local_3d4,&local_3a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            LOCK();
            (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i =
                 (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i + (long)local_3d4;
            UNLOCK();
            pthread_mutex_unlock(local_380);
            if (local_3e0._M_head_impl != (uchar *)0x0) {
              operator_delete__(local_3e0._M_head_impl);
            }
          }
          if (((this->m_fBytesReceivedParam).super__Function_base._M_manager != (_Manager_type)0x0
               || (this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0) &&
             (local_3e1 == true && (this->super_BaseSocketImpl).m_bStop == false)) {
            iVar3 = pthread_mutex_lock(&local_2e8);
            if (iVar3 != 0) {
              std::__throw_system_error(iVar3);
            }
            if (local_3e2 == '\0') {
              local_3e2 = '\x01';
              local_3e0._M_head_impl = (uchar *)0x0;
              local_3a8._M_dataplus._M_p = (pointer)operator_new(0x20);
              *(undefined ***)local_3a8._M_dataplus._M_p = &PTR___State_00148828;
              *(pthread_mutex_t **)((long)local_3a8._M_dataplus._M_p + 8) = &local_2e8;
              *(UdpSocketImpl **)((long)local_3a8._M_dataplus._M_p + 0x10) = this;
              *(char **)((long)local_3a8._M_dataplus._M_p + 0x18) = &local_3e2;
              std::thread::_M_start_thread(&local_3e0,&local_3a8,0);
              if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
              }
              std::thread::detach();
              if (local_3e0._M_head_impl != (uchar *)0x0) {
                std::terminate();
              }
            }
            pthread_mutex_unlock(&local_2e8);
          }
          if (local_3d0[0] != local_3c0) {
            operator_delete(local_3d0[0],local_3c0[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
          std::ios_base::~ios_base(aiStack_138);
          bVar14 = true;
          piVar11 = local_350;
        }
      }
    }
LAB_0011c5e9:
    if (!bVar14) {
LAB_0011cb08:
      if ((((local_3b0 & 1) == 0) && ((this->super_BaseSocketImpl).m_iError == 0)) &&
         (iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,0), iVar3 != 0)) {
        piVar11 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar11;
        (this->super_BaseSocketImpl).m_iErrLoc = 10;
      }
      if (local_3e2 == '\x01') {
        do {
          local_1b8.tv_sec = 0;
          local_1b8.tv_nsec = 10000000;
          do {
            iVar3 = nanosleep(&local_1b8,&local_1b8);
            if (iVar3 != -1) break;
            piVar11 = __errno_location();
          } while (*piVar11 == 4);
        } while (local_3e2 != '\0');
      }
      iVar3 = pthread_mutex_lock(&local_2e8);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      pthread_mutex_unlock(&local_2e8);
      LOCK();
      paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
      (paVar1->super___atomic_base<unsigned_char>)._M_i =
           (paVar1->super___atomic_base<unsigned_char>)._M_i | 1;
      UNLOCK();
      paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
      LOCK();
      bVar14 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (bVar14) {
        (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
      if (bVar14) {
        iVar3 = (this->super_BaseSocketImpl).m_fSock;
        if (iVar3 != -1) {
          close(iVar3);
        }
        (this->super_BaseSocketImpl).m_fSock = -1;
        if ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
            (_Manager_type)0x0 ||
            (this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
            (_Manager_type)0x0) {
          (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
        }
      }
      operator_delete__(__s);
      return;
    }
  } while( true );
}

Assistant:

void UdpSocketImpl::SelectThread()
{
    bool bReadCall = false;
    mutex mxNotify;
    bool bSocketShutDown = false;
	auto buf = make_unique<char[]>(0x0000ffff);

    while (m_bStop == false)
    {
        if (m_atInBytes > 0x40000)  // More than 256 KB in the receive buffer
        {
            this_thread::sleep_for(chrono::milliseconds(1));
            continue;
        }

        fd_set readfd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &readfd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 7;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &readfd))
            {
                union
                {
                    sockaddr_in sin;
                    sockaddr_in6 sin6;
                }SenderAddr;
                socklen_t sinLen = sizeof(SenderAddr);

                int32_t transferred = ::recvfrom(m_fSock, &buf[0], 0x0000ffff, 0, reinterpret_cast<sockaddr*>(&SenderAddr), &sinLen);

                if (transferred <= 0)
                {
                    if (transferred == 0)
                    {   // The connection was shutdown from the other side, there will be no more bytes to read on that connection
                        // We set the flag, so we don't read on the connection any more
                        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                        {
                            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                            m_iErrLoc = 9;
                        }
                        bSocketShutDown = true;

                        while (bReadCall == true)
                            this_thread::sleep_for(chrono::milliseconds(10));

                        UdpSocket* pUdpSocket = dynamic_cast<UdpSocket*>(m_pBkRef);
                        if (m_fBytesReceivedParam && pUdpSocket != nullptr)
                            m_fBytesReceivedParam(pUdpSocket, m_pvUserData);
                        else if (m_fBytesReceived && pUdpSocket != nullptr)
                            m_fBytesReceived(pUdpSocket);
                        break;
                    }
                    else
                    {
                        m_iError = WSAGetLastError();
                        if (m_iError != WSAEWOULDBLOCK)
                        {
                            m_iErrLoc = 11;
                            if (m_fErrorParam && m_bStop == false)
                                m_fErrorParam(m_pBkRef, m_pvUserData);
                            else if (m_fError && m_bStop == false)
                                m_fError(m_pBkRef);
                            break;
                        }
                    }
                }
                else
                {
                    stringstream strAbsender;
                    string caAddrBuf(INET6_ADDRSTRLEN + 1, 0);
                    if (SenderAddr.sin6.sin6_family == AF_INET6)
                    {
                        strAbsender << "[" << inet_ntop(SenderAddr.sin6.sin6_family, &SenderAddr.sin6.sin6_addr, &caAddrBuf[0], sizeof(caAddrBuf));
                        strAbsender << "]:" << ntohs(SenderAddr.sin6.sin6_port);
                    }
                    else
                    {
                        strAbsender << inet_ntop(SenderAddr.sin.sin_family, &SenderAddr.sin.sin_addr, &caAddrBuf[0], sizeof(caAddrBuf));
                        strAbsender << ":" << ntohs(SenderAddr.sin.sin_port);
                    }

                    int iRet = 0;
                    if (m_fnSslDecode == nullptr || (iRet = m_fnSslDecode(reinterpret_cast<uint8_t*>(&buf[0]), transferred, strAbsender.str()), iRet == 0))
                    {
                        auto tmp = make_unique<uint8_t[]>(transferred);
                        copy_n(&buf[0], transferred, &tmp[0]);
                        m_mxInDeque.lock();
                        m_quInData.emplace_back(move(tmp), transferred, strAbsender.str());
                        m_atInBytes += transferred;
                        m_mxInDeque.unlock();
                    }

                    if ((m_fBytesReceived || m_fBytesReceivedParam) && m_bStop == false && iRet != -1)
                    {
                        lock_guard<mutex> lock(mxNotify);
                        if (bReadCall == false)
                        {
                            bReadCall = true;
                            thread([&]()
                            {
                                mxNotify.lock();
                                while (m_atInBytes > 0 && m_bStop == false)
                                {
                                    UdpSocket* pUdpSocket = dynamic_cast<UdpSocket*>(m_pBkRef);
                                    mxNotify.unlock();
                                    if (m_fBytesReceivedParam != nullptr && pUdpSocket != nullptr)
                                        m_fBytesReceivedParam(pUdpSocket, m_pvUserData);
                                    else if (pUdpSocket != nullptr)
                                        m_fBytesReceived(pUdpSocket);
                                    mxNotify.lock();
                                }
                                bReadCall = false;
                                mxNotify.unlock();
                            }).detach();
                        }
                    }
                }
            }
        }
    }

    if (bSocketShutDown == false && m_iError == 0)
    {
        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error RECEIVE shutdown socket\r\n");
            m_iErrLoc = 10;
        }
    }

    while (bReadCall == true)
        this_thread::sleep_for(chrono::milliseconds(10));

    mxNotify.lock();    // In rare cases, bReadCall was set to false, and the task switch
    mxNotify.unlock();  // ended that thread before the lambda thread released mxNotify -> crash

    m_iShutDownState |= 1;

    unsigned char cExpected = 3;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        if (m_fClosing || m_fClosingParam)
            StartClosingCB();
    }
}